

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ctl.c
# Opt level: O1

t_int * vline_tilde_perform(t_int *w)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  long lVar5;
  double *fatso;
  int iVar6;
  float *pfVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double local_50;
  
  lVar5 = w[1];
  pfVar7 = (float *)w[2];
  iVar4 = (int)w[3];
  local_50 = *(double *)(lVar5 + 0x30);
  dVar10 = *(double *)(lVar5 + 0x38);
  dVar1 = *(double *)(lVar5 + 0x60);
  dVar8 = clock_gettimesince(*(double *)(lVar5 + 0x40));
  fatso = *(double **)(lVar5 + 0x80);
  if ((dVar8 != *(double *)(lVar5 + 0x48)) || (NAN(dVar8) || NAN(*(double *)(lVar5 + 0x48)))) {
    iVar6 = 0x40;
    if (0x40 < iVar4) {
      iVar6 = iVar4;
    }
    *(double *)(lVar5 + 0x48) = dVar8;
    *(double *)(lVar5 + 0x50) = dVar8 - (double)iVar6 * dVar1;
  }
  dVar8 = *(double *)(lVar5 + 0x50);
  *(double *)(lVar5 + 0x50) = (double)iVar4 * dVar1 + dVar8;
  if (0 < iVar4) {
    iVar6 = 0;
    do {
      dVar8 = dVar8 + dVar1;
      if (fatso != (double *)0x0) {
        dVar2 = fatso[1];
        while (dVar2 < dVar8) {
          if (*(double *)(lVar5 + 0x68) <= dVar8) {
            local_50 = (double)*(float *)(lVar5 + 0x70);
          }
          dVar3 = *fatso;
          dVar10 = 0.0;
          dVar9 = (double)*(float *)(fatso + 2);
          if (dVar2 < dVar3) {
            dVar9 = ((double)*(float *)(fatso + 2) - local_50) / (dVar3 - dVar2);
            dVar10 = dVar9 * dVar1;
            dVar9 = (dVar8 - dVar2) * dVar9 + local_50;
          }
          local_50 = dVar9;
          *(double *)(lVar5 + 0x38) = dVar10;
          *(undefined4 *)(lVar5 + 0x70) = *(undefined4 *)(fatso + 2);
          *(double *)(lVar5 + 0x68) = dVar3;
          *(double *)(lVar5 + 0x80) = fatso[3];
          freebytes(fatso,0x20);
          fatso = *(double **)(lVar5 + 0x80);
          if (fatso == (double *)0x0) break;
          dVar2 = fatso[1];
        }
      }
      if (*(double *)(lVar5 + 0x68) <= dVar8) {
        local_50 = (double)*(float *)(lVar5 + 0x70);
        *(undefined8 *)(lVar5 + 0x38) = 0;
        *(undefined8 *)(lVar5 + 0x68) = 0x4415af1d78b58c40;
        dVar10 = 0.0;
      }
      *pfVar7 = (float)local_50;
      pfVar7 = pfVar7 + 1;
      local_50 = local_50 + dVar10;
      iVar6 = iVar6 + 1;
    } while (iVar6 != iVar4);
  }
  *(double *)(lVar5 + 0x30) = local_50;
  return w + 4;
}

Assistant:

static t_int *vline_tilde_perform(t_int *w)
{
    t_vline *x = (t_vline *)(w[1]);
    t_sample *out = (t_sample *)(w[2]);
    int n = (int)(w[3]), i;
    double f = x->x_value;
    double inc = x->x_inc;
    double msecpersamp = x->x_msecpersamp;
    double timenow, logicaltimenow = clock_gettimesince(x->x_referencetime);
    t_vseg *s = x->x_list;
    if (logicaltimenow != x->x_lastlogicaltime)
    {
        int sampstotime = (n > DEFDACBLKSIZE ? n : DEFDACBLKSIZE);
        x->x_lastlogicaltime = logicaltimenow;
        x->x_nextblocktime = logicaltimenow - sampstotime * msecpersamp;
    }
    timenow = x->x_nextblocktime;
    x->x_nextblocktime = timenow + n * msecpersamp;
    for (i = 0; i < n; i++)
    {
        double timenext = timenow + msecpersamp;
    checknext:
        if (s)
        {
            /* has starttime elapsed?  If so update value and increment */
            if (s->s_starttime < timenext)
            {
                if (x->x_targettime <= timenext)
                    f = x->x_target, inc = 0;
                    /* if zero-length segment bash output value */
                if (s->s_targettime <= s->s_starttime)
                {
                    f = s->s_target;
                    inc = 0;
                }
                else
                {
                    double incpermsec = (s->s_target - f)/
                        (s->s_targettime - s->s_starttime);
                    f = f + incpermsec * (timenext - s->s_starttime);
                    inc = incpermsec * msecpersamp;
                }
                x->x_inc = inc;
                x->x_target = s->s_target;
                x->x_targettime = s->s_targettime;
                x->x_list = s->s_next;
                t_freebytes(s, sizeof(*s));
                s = x->x_list;
                goto checknext;
            }
        }
        if (x->x_targettime <= timenext)
            f = x->x_target, inc = x->x_inc = 0, x->x_targettime = 1e20;
        *out++ = f;
        f = f + inc;
        timenow = timenext;
    }
    x->x_value = f;
    return (w+4);
}